

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS
ref_node_eliminate_active_parts
          (REF_INT n,REF_INT *counts,REF_INT chunk,REF_INT active0,REF_INT *active1,REF_INT *nactive
          )

{
  int iVar1;
  ulong uVar2;
  
  uVar2 = (ulong)active0;
  *nactive = counts[uVar2];
  while( true ) {
    iVar1 = (int)uVar2 + 1;
    *active1 = iVar1;
    if ((n <= iVar1) || (chunk < counts[iVar1] + *nactive)) break;
    *nactive = counts[iVar1] + *nactive;
    uVar2 = (ulong)(uint)*active1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_eliminate_active_parts(REF_INT n, REF_INT *counts,
                                                   REF_INT chunk,
                                                   REF_INT active0,
                                                   REF_INT *active1,
                                                   REF_INT *nactive) {
  (*nactive) = counts[active0];
  (*active1) = active0 + 1;
  while ((*active1) < n && ((*nactive) + counts[(*active1)]) <= chunk) {
    (*nactive) += counts[(*active1)];
    (*active1)++;
  }

  return REF_SUCCESS;
}